

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestNumbers(void)

{
  WJTL_STATUS WVar1;
  _Bool _result_25;
  _Bool _result_24;
  _Bool _result_23;
  _Bool _result_22;
  _Bool _result_21;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  
  __result_7 = WJTL_STATUS_SUCCESS;
  WVar1 = VerifyOutputUnsigned(10,"10");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( 10, \"10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x71);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputUnsigned(0,"0");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( 0, \"0\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x72);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputUnsigned(0xffffffffffffffff,"18446744073709551615");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( (18446744073709551615UL), \"18446744073709551615\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x73);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputSigned(10,"10");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputSigned( 10, \"10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x75);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputSigned(-10,"-10");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputSigned( -10, \"-10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x76);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(0.0,"0");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 0.0, \"0\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x78);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(10.1,"10.1");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 10.1, \"10.1\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x79);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.34e+125,"2.34e+125");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.34e+125, \"2.34e+125\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7a);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.34e+125,"2.34e+125");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 234e123, \"2.34e+125\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7b);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.1,"2.1");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1, \"2.1\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7d);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.11,"2.11");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11, \"2.11\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7e);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.111,"2.111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111, \"2.111\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7f);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.1111,"2.1111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111, \"2.1111\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x80);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.11111,"2.11111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111, \"2.11111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x81);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.111111,"2.111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111, \"2.111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x82);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.1111111,"2.1111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111, \"2.1111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x83);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.11111111,"2.11111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111, \"2.11111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x84);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.111111111,"2.111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111, \"2.111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x85);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.1111111111,"2.1111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111111, \"2.1111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x86);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.11111111111,"2.11111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111111, \"2.11111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x87);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.111111111111,"2.111111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111111, \"2.111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x88);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.1111111111111,"2.1111111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111111111, \"2.1111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x89);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.11111111111111,"2.11111111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111111111, \"2.11111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x8a);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.111111111111111,"2.111111111111111");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111111111, \"2.111111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x8b);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(1.79769313486232e+308,"1.797693134862316e+308");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 1.7976931348623157e+308, \"1.797693134862316e+308\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x91);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyOutputFloat(2.2250738585072014e-308,"2.225073858507201e-308");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.2250738585072014e-308, \"2.225073858507201e-308\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x92);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  return __result_7;
}

Assistant:

static
WJTL_STATUS
    TestNumbers
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test valid numbers
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "1", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, " 100", 100 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, " 18446744073709551615 ", UINT64_MAX ) );

    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectSigned( IsJson5, " -1 ", -1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectSigned( IsJson5, " -9223372036854775808 ", INT64_MIN ) );

    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, " 1.0 ", 1.0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, " -1.0 ", -1.0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "12345.67891", 12345.67891 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "123.45e50", 123.45e50 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "123.45e+50", 123.45e50 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "-123.45e-50", -123.45e-50 ) );

    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "1.7976931348623158e308", DBL_MAX ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "1.7976931348623158e+308", DBL_MAX ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "2.2250738585072014e-308", DBL_MIN ) );

    // Very large integers will be treated as floating point if they can't be represented in a uint64_t or int64_t.
    // Verify that it gets rounded to correct float
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "18446744073709551616", 18446744073709552000.0 ) ); // Rounded
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "-9223372036854775809", -9223372036854775800.0 ) ); // Rounded

    // Test technically valid json numbers but ones our implementation can not handle
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1e309", 0 ) );      // This will become Inf
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "-1e309", 0 ) );      // This will become -Inf

    if( IsJson5 )
    {
        // Test hex numbers
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x0", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x0000", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x1", 1 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x1234", 0x1234 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0X1234", 0X1234 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0xabcd", 0xabcd ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0xEEFF", 0xeeff ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0xffffffffffffffff", 0xffffffffffffffff ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x1ffffffffffffffff", 0 ) );
    }

    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, ".2", 0.2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "+0.2", 0.2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "2.", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "+2", 2 ) );

        // Test special "numbers"
        double f64 = 0;
        const double a_inf = DBL_MAX * 2.0;
        const double a_ninf = DBL_MAX * -2.0;

        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "Inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "+Inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "+inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "-Inf", &f64 ) );
        JL_ASSERT( a_ninf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "-inf", &f64 ) );
        JL_ASSERT( a_ninf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "NaN", &f64 ) );
        JL_ASSERT( f64 != f64 );        // Tests for NaN
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "NaN", &f64 ) );
        JL_ASSERT( f64 != f64 );        // Tests for NaN
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, ".2", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "+0.2", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "2.", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "+2", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "Inf", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "+Inf", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "-Inf", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "Nan", 0 ) );
    }

    // Test invalid numbers
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1.2.3", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "E10", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "-E10", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1E.10", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "11E1.0", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1E1+0", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1E1-0", 0 ) );

    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 0x1234", 1 ) );
    }
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x12.34", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x111G", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x", 0 ) );

    return TestReturn;
}